

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O2

key_components * rsa_components(RSAKey *rsa)

{
  key_components *kc;
  
  kc = key_components_new();
  key_components_add_text(kc,"key_type","RSA");
  key_components_add_mp(kc,"public_modulus",rsa->modulus);
  key_components_add_mp(kc,"public_exponent",rsa->exponent);
  if (rsa->private_exponent != (mp_int *)0x0) {
    key_components_add_mp(kc,"private_exponent",rsa->private_exponent);
    key_components_add_mp(kc,"private_p",rsa->p);
    key_components_add_mp(kc,"private_q",rsa->q);
    key_components_add_mp(kc,"private_inverse_q_mod_p",rsa->iqmp);
  }
  return kc;
}

Assistant:

key_components *rsa_components(RSAKey *rsa)
{
    key_components *kc = key_components_new();
    key_components_add_text(kc, "key_type", "RSA");
    key_components_add_mp(kc, "public_modulus", rsa->modulus);
    key_components_add_mp(kc, "public_exponent", rsa->exponent);
    if (rsa->private_exponent) {
        key_components_add_mp(kc, "private_exponent", rsa->private_exponent);
        key_components_add_mp(kc, "private_p", rsa->p);
        key_components_add_mp(kc, "private_q", rsa->q);
        key_components_add_mp(kc, "private_inverse_q_mod_p", rsa->iqmp);
    }
    return kc;
}